

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_value.cpp
# Opt level: O2

value_ptr __thiscall pstore::dump::make_value(dump *this,header *header)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar1;
  value_ptr vVar2;
  initializer_list<pstore::dump::object::member> __l;
  allocator_type local_2b7;
  allocator local_2b6;
  allocator local_2b5;
  allocator local_2b4;
  allocator local_2b3;
  allocator local_2b2;
  allocator local_2b1;
  address in_stack_fffffffffffffd50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2a8;
  value_ptr local_2a0;
  value_ptr local_290;
  value_ptr local_280;
  value_ptr local_270;
  value_ptr local_260;
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_250;
  string local_238;
  string local_218;
  string local_1f8;
  uint32_t *local_1d8;
  array<unsigned_short,_2UL> *local_1d0;
  string local_1c8;
  string local_1a8;
  uint32_t *local_188;
  header *local_180;
  string local_178;
  uuid local_158;
  member local_148 [4];
  member local_88;
  member local_58;
  
  std::__cxx11::string::string((string *)&local_178,"signature1",&local_2b1);
  local_188 = &(header->a).signature2;
  local_180 = header;
  make_value<unsigned_char_const*,unsigned_char,std::shared_ptr<pstore::dump::value>(*)(unsigned_char_const&)>
            ((dump *)&local_260,(uchar **)&local_180,(uchar **)&local_188,
             details::default_make_value<unsigned_char_const&>);
  object::member::member(local_148,&local_178,&local_260);
  std::__cxx11::string::string((string *)&local_1a8,"signature2",&local_2b2);
  make_value((uint32_t *)&local_270);
  object::member::member(local_148 + 1,&local_1a8,&local_270);
  std::__cxx11::string::string((string *)&local_1c8,"version",&local_2b3);
  local_1d0 = &(header->a).version;
  local_1d8 = &(header->a).header_size;
  make_value<unsigned_short_const*,unsigned_short,std::shared_ptr<pstore::dump::value>(*)(unsigned_short_const&)>
            ((dump *)&local_280,(unsigned_short **)&local_1d0,(unsigned_short **)&local_1d8,
             details::default_make_value<unsigned_short_const&>);
  object::member::member(local_148 + 2,&local_1c8,&local_280);
  std::__cxx11::string::string((string *)&local_1f8,"id",&local_2b4);
  local_158.data_._M_elems._0_8_ = *(undefined8 *)(header->a).id.data_._M_elems;
  local_158.data_._M_elems._8_8_ = *(undefined8 *)((header->a).id.data_._M_elems + 8);
  make_value((dump *)&local_290,&local_158);
  object::member::member(local_148 + 3,&local_1f8,&local_290);
  std::__cxx11::string::string((string *)&local_218,"crc",&local_2b5);
  make_value((uint32_t *)&local_2a0);
  object::member::member(&local_88,&local_218,&local_2a0);
  std::__cxx11::string::string((string *)&local_238,"footer_pos",&local_2b6);
  make_value(in_stack_fffffffffffffd50);
  object::member::member(&local_58,&local_238,(value_ptr *)&stack0xfffffffffffffd50);
  __l._M_len = 6;
  __l._M_array = local_148;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            (&local_250,__l,&local_2b7);
  make_value((container *)this);
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_250);
  lVar1 = 0xf0;
  do {
    object::member::~member((member *)((long)&local_148[0].property._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2a8);
  std::__cxx11::string::~string((string *)&local_238);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2a0.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_218);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_290.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_280.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_270.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_260.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_178);
  vVar2.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  vVar2.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (value_ptr)vVar2.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

value_ptr make_value (header const & header) {
            auto const & version = header.version ();
            return make_value (object::container{
                {"signature1",
                 make_value (std::begin (header.a.signature1), std::end (header.a.signature1))},
                {"signature2", make_value (header.a.signature2)},
                {"version", make_value (std::begin (version), std::end (version))},
                {"id", make_value (header.id ())},
                {"crc", make_value (header.crc)},
                {"footer_pos", make_value (header.footer_pos.load ())},
            });
        }